

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O1

void pzshape::TPZShapePiram::ShapeInternal
               (int side,TPZVec<double> *x,int order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  long *plVar1;
  
  if (0xfffffff1 < side - 0x13U) {
    switch(side) {
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      TPZShapeLinear::ShapeInternal(x,order,phi,dphi);
      return;
    case 0xd:
      TPZShapeQuad::ShapeInternal(x,order,phi,dphi);
      return;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
      TPZShapeTriang::ShapeInternal(x,order,phi,dphi);
      return;
    case 0x12:
      ShapeInternal(x,order,phi,dphi);
      return;
    default:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "static void pzshape::TPZShapePiram::ShapeInternal(int, TPZVec<REAL> &, int, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &)"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," Wrong side parameter side ",0x1b);
      plVar1 = (long *)std::ostream::operator<<(&std::cout,side);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapepiram.cpp"
                 ,0x27a);
    }
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapepiram.cpp"
             ,0x254);
}

Assistant:

void TPZShapePiram::ShapeInternal(int side, TPZVec<REAL> &x, int order,
                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi){
        if (side < 5 || side > 18) {
            DebugStop();
        }
        
        switch (side) {
                
            case 5:
            case 6:
            case 7:
            case 8:
            case 9:
            case 10:
            case 11:
            case 12:
            {
                pzshape::TPZShapeLinear::ShapeInternal(x, order, phi, dphi);
            }
                break;
            case 13:
            {
                pzshape::TPZShapeQuad::ShapeInternal(x, order, phi, dphi);
            }
                break;
            case 14:
            case 15:
            case 16:
            case 17:
            {
                pzshape::TPZShapeTriang::ShapeInternal(x, order, phi, dphi);
            }
                break;
            
            case 18:
            {
                ShapeInternal(x, order, phi, dphi);
            }
                break;
            default:
                std::cout << __PRETTY_FUNCTION__ << " Wrong side parameter side " << side << std::endl;
                DebugStop();
                break;
        }
       
        
    }